

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O2

bool __thiscall cmSetPropertyCommand::HandleGlobalMode(cmSetPropertyCommand *this)

{
  size_t sVar1;
  cmake *this_00;
  char *value;
  char *value_00;
  allocator<char> local_39;
  string local_38;
  
  sVar1 = (this->Names)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar1 == 0) {
    this_00 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    if (this->Remove == false) {
      value = (this->PropertyValue)._M_dataplus._M_p;
    }
    else {
      value = (char *)0x0;
    }
    if (this->AppendMode == true) {
      value_00 = "";
      if (value != (char *)0x0) {
        value_00 = value;
      }
      cmake::AppendProperty(this_00,&this->PropertyName,value_00,this->AppendAsString);
    }
    else {
      cmake::SetProperty(this_00,&this->PropertyName,value);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"given names for GLOBAL scope.",&local_39);
    cmCommand::SetError(&this->super_cmCommand,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return sVar1 == 0;
}

Assistant:

bool cmSetPropertyCommand::HandleGlobalMode()
{
  if (!this->Names.empty()) {
    this->SetError("given names for GLOBAL scope.");
    return false;
  }

  // Set or append the property.
  cmake* cm = this->Makefile->GetCMakeInstance();
  std::string const& name = this->PropertyName;
  const char* value = this->PropertyValue.c_str();
  if (this->Remove) {
    value = nullptr;
  }
  if (this->AppendMode) {
    cm->AppendProperty(name, value ? value : "", this->AppendAsString);
  } else {
    cm->SetProperty(name, value);
  }

  return true;
}